

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O0

void __thiscall qclab::qgates::CZ<double>::CZ(CZ<double> *this)

{
  CZ<double> *this_local;
  
  QControlledGate2<double>::QControlledGate2(&this->super_QControlledGate2<double>,0,1);
  (this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016ca48;
  std::make_unique<qclab::qgates::PauliZ<double>,int>((int *)&this->gate_);
  return;
}

Assistant:

CZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliZ< T > >( 1 ) )
        { }